

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O2

DisasJumpType op_vfma(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  uint32_t cofs;
  code *pcVar4;
  code *fn;
  DisasJumpType DVar5;
  bool bVar6;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = get_field1(s,FLD_O_m5,FLD_C_d1);
  uVar2 = get_field1(s,FLD_O_m6,FLD_C_d2);
  if ((uVar1 & 7) == 0 && (uVar2 & 0xff) == 3) {
    bVar6 = (uVar1 & 8) == 0;
    pcVar4 = gen_helper_gvec_vfma64s;
    if (bVar6) {
      pcVar4 = gen_helper_gvec_vfma64;
    }
    fn = gen_helper_gvec_vfms64s;
    if (bVar6) {
      fn = gen_helper_gvec_vfms64;
    }
    if ((s->fields).field_0x9 == -0x71) {
      fn = pcVar4;
    }
    DVar5 = DISAS_NEXT;
    iVar3 = get_field1(s,FLD_O_v1,FLD_C_b1);
    dofs = vec_full_reg_offset((uint8_t)iVar3);
    iVar3 = get_field1(s,FLD_O_v2,FLD_C_d4);
    aofs = vec_full_reg_offset((uint8_t)iVar3);
    iVar3 = get_field1(s,FLD_O_v3,FLD_C_i3);
    bofs = vec_full_reg_offset((uint8_t)iVar3);
    iVar3 = get_field1(s,FLD_O_v4,FLD_C_b4);
    cofs = vec_full_reg_offset((uint8_t)iVar3);
    tcg_gen_gvec_4_ptr_s390x(tcg_ctx,dofs,aofs,bofs,cofs,tcg_ctx->cpu_env,0x10,0x10,0,fn);
  }
  else {
    gen_program_exception(s,6);
    DVar5 = DISAS_NORETURN;
  }
  return DVar5;
}

Assistant:

static DisasJumpType op_vfma(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t m5 = get_field(s, m5);
    const uint8_t fpf = get_field(s, m6);
    const bool se = extract32(m5, 3, 1);
    gen_helper_gvec_4_ptr *fn;

    if (fpf != FPF_LONG || extract32(m5, 0, 3)) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    if (s->fields.op2 == 0x8f) {
        fn = se ? gen_helper_gvec_vfma64s : gen_helper_gvec_vfma64;
    } else {
        fn = se ? gen_helper_gvec_vfms64s : gen_helper_gvec_vfms64;
    }
    gen_gvec_4_ptr(tcg_ctx, get_field(s, v1), get_field(s, v2),
                   get_field(s, v3), get_field(s, v4), tcg_ctx->cpu_env,
                   0, fn);
    return DISAS_NEXT;
}